

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_qcx_getcompparms
              (jpc_qcxcp_t *compparms,jpc_cstate_t *cstate,jas_stream_t *in,uint_fast16_t len)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  uint_fast16_t *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint_fast8_t tmp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = jpc_getuint8((jas_stream_t *)cstate,(uint_fast8_t *)((long)&uStack_38 + 7));
  if (iVar2 != 0) {
    return -1;
  }
  bVar1 = uStack_38._7_1_ & 0x1f;
  compparms->qntsty = bVar1;
  compparms->numguard = uStack_38._7_1_ >> 5;
  if ((uStack_38 & 0x1f00000000000000) == 0) {
    uVar5 = (ulong)((int)in - 1);
LAB_0011b524:
    compparms->numstepsizes = (int)uVar5;
LAB_0011b52e:
    if (100 < (int)uVar5) goto LAB_0011b5c8;
    if (0 < (int)uVar5) goto LAB_0011b53d;
    compparms->stepsizes = (uint_fast16_t *)0x0;
  }
  else {
    if (bVar1 != 1) {
      if (bVar1 == 2) {
        uVar5 = (ulong)((long)&in[-1].rwlimit_ + 7) >> 1;
        goto LAB_0011b524;
      }
      uVar5 = (ulong)(uint)compparms->numstepsizes;
      goto LAB_0011b52e;
    }
    compparms->numstepsizes = 1;
    uVar5 = 1;
LAB_0011b53d:
    puVar3 = (uint_fast16_t *)jas_alloc2(uVar5 & 0xffffffff,8);
    compparms->stepsizes = puVar3;
    if (puVar3 == (uint_fast16_t *)0x0) {
      abort();
    }
    if (0 < compparms->numstepsizes) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        if (compparms->qntsty == '\0') {
          iVar2 = jpc_getuint8((jas_stream_t *)cstate,(uint_fast8_t *)((long)&uStack_38 + 7));
          if (iVar2 != 0) goto LAB_0011b5c8;
          *(ulong *)((long)compparms->stepsizes + lVar6) = (ulong)((uStack_38._7_1_ & 0xf8) << 8);
        }
        else {
          iVar2 = jpc_getuint16((jas_stream_t *)cstate,
                                (uint_fast16_t *)((long)compparms->stepsizes + lVar6));
          if (iVar2 != 0) goto LAB_0011b5c8;
        }
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 8;
      } while (lVar4 < compparms->numstepsizes);
    }
  }
  if ((cstate[1].numcomps & 3) == 0) {
    return 0;
  }
LAB_0011b5c8:
  if (compparms->stepsizes != (uint_fast16_t *)0x0) {
    jas_free(compparms->stepsizes);
  }
  return -1;
}

Assistant:

static int jpc_qcx_getcompparms(jpc_qcxcp_t *compparms, jpc_cstate_t *cstate,
  jas_stream_t *in, uint_fast16_t len)
{
	uint_fast8_t tmp;
	int n;
	int i;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	n = 0;
	if (jpc_getuint8(in, &tmp)) {
		return -1;
	}
	++n;
	compparms->qntsty = tmp & 0x1f;
	compparms->numguard = (tmp >> 5) & 7;
	switch (compparms->qntsty) {
	case JPC_QCX_SIQNT:
		compparms->numstepsizes = 1;
		break;
	case JPC_QCX_NOQNT:
		compparms->numstepsizes = (len - n);
		break;
	case JPC_QCX_SEQNT:
		/* XXX - this is a hack */
		compparms->numstepsizes = (len - n) / 2;
		break;
	}
	/* Ensure that the step size array is sufficiently large. */
	if (compparms->numstepsizes > 3 * JPC_MAXRLVLS + 1) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	if (compparms->numstepsizes > 0) {
		if (!(compparms->stepsizes = jas_alloc2(compparms->numstepsizes,
		  sizeof(uint_fast16_t)))) {
			abort();
		}
		for (i = 0; i < compparms->numstepsizes; ++i) {
			if (compparms->qntsty == JPC_QCX_NOQNT) {
				if (jpc_getuint8(in, &tmp)) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
				compparms->stepsizes[i] = JPC_QCX_EXPN(tmp >> 3);
			} else {
				if (jpc_getuint16(in, &compparms->stepsizes[i])) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
			}
		}
	} else {
		compparms->stepsizes = 0;
	}
	if (jas_stream_error(in) || jas_stream_eof(in)) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	return 0;
}